

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manager.cpp
# Opt level: O3

void __thiscall SHOPManagement::Manager::display(Manager *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppAVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*** ",4);
  (*(this->super_Person).super_User._vptr_User[2])(&local_40,this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Information ***",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First Name: ",0xc);
  Person::getFirstName_abi_cxx11_(&local_40,&this->super_Person);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Last Name: ",0xb);
  Person::getLastName_abi_cxx11_(&local_40,&this->super_Person);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Phone Number: ",0xe);
  Person::getPhoneNumber_abi_cxx11_(&local_40,&this->super_Person);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  uVar5 = (uint)((ulong)((long)(this->super_Person).v_adress_list.
                               super__Vector_base<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_Person).v_adress_list.
                              super__Vector_base<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar5) {
    uVar4 = 0;
    do {
      ppAVar2 = (this->super_Person).v_adress_list.
                super__Vector_base<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_Person).v_adress_list.
                        super__Vector_base<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      (**ppAVar2[uVar4]->_vptr_Address)();
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  return;
}

Assistant:

void Manager::display()
    {
        std::cout << "*** " << this->className() << " Information ***" << std::endl;
        std::cout << "First Name: " << this->getFirstName() << std::endl;
        std::cout << "Last Name: " << this->getLastName() << std::endl;
        std::cout << "Phone Number: " << this->getPhoneNumber() << std::endl;

        for (int i = 0, len = this->v_adress_list.size(); i < len; i++)
        {
            this->v_adress_list.at(i)->display();
        }
    }